

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

lys_node * resolve_json_nodeid(char *nodeid,ly_ctx *ctx,lys_node *start,int output)

{
  char cVar1;
  LYS_NODE LVar2;
  uint uVar3;
  int iVar4;
  lys_node_list *parent;
  lys_node_list *list;
  lys_node_list *node;
  lys_module *plVar5;
  lys_module *plVar6;
  lys_module *module;
  char *pcVar7;
  char *yang_data_name;
  LY_ECODE ecode;
  ly_ctx *ctx_00;
  ulong uVar8;
  char *id;
  size_t __n;
  int local_80;
  char *local_78;
  char *name;
  char *local_68;
  int local_5c;
  char *pcStack_58;
  int has_predicate;
  char *local_50;
  char *mod_name;
  uint local_40;
  int local_3c;
  int local_38;
  int nam_len;
  int is_relative;
  int mod_name_len;
  
  local_38 = -1;
  if ((nodeid == (char *)0x0) || (ctx == (ly_ctx *)0x0 && start == (lys_node *)0x0)) {
    __assert_fail("nodeid && (ctx || start)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x931,
                  "const struct lys_node *resolve_json_nodeid(const char *, const struct ly_ctx *, const struct lys_node *, int)"
                 );
  }
  if (ctx == (ly_ctx *)0x0) {
    ctx = start->module->ctx;
  }
  uVar3 = parse_schema_nodeid(nodeid,&local_50,&nam_len,&local_78,&local_3c,&local_38,(int *)0x0,
                              (int *)0x0,1);
  if ((int)uVar3 < 1) {
    pcVar7 = nodeid + -uVar3;
    uVar8 = (ulong)(uint)(int)nodeid[-uVar3];
  }
  else {
    if (*local_78 == '#') {
      if (local_38 != 0) {
        uVar8 = 0x23;
        pcVar7 = local_78;
        goto LAB_001135f0;
      }
      yang_data_name = local_78 + 1;
      local_80 = local_3c + -1;
      name = (char *)CONCAT44(name._4_4_,nam_len);
      id = nodeid + uVar3;
      pcVar7 = local_50;
    }
    else {
      local_38 = -1;
      pcVar7 = (char *)0x0;
      yang_data_name = (char *)0x0;
      id = nodeid;
    }
    local_68 = nodeid;
    mod_name = (char *)ctx;
    local_40 = parse_schema_nodeid(id,&local_50,&nam_len,&local_78,&local_3c,&local_38,&local_5c,
                                   (int *)0x0,0);
    ctx_00 = (ly_ctx *)mod_name;
    uVar8 = (ulong)local_40;
    if (0 < (int)local_40) {
      if (pcVar7 != (char *)0x0) {
        nam_len = (int)name;
        local_50 = pcVar7;
      }
      pcStack_58 = id;
      if (local_38 == 0) {
        if (local_50 == (char *)0x0) {
          ly_vlog((ly_ctx *)mod_name,LYE_PATH_MISSMOD,LY_VLOG_STR,local_68);
          return (lys_node *)0x0;
        }
        pcVar7 = strndup(local_50,(long)nam_len);
        module = ly_ctx_get_module(ctx_00,pcVar7,(char *)0x0,1);
        free(pcVar7);
        if (module == (lys_module *)0x0) {
          pcVar7 = strndup(local_68,(size_t)(local_50 + ((long)nam_len - (long)local_68)));
          ecode = LYE_PATH_INMOD;
LAB_001135c2:
          ly_vlog(ctx_00,ecode,LY_VLOG_STR,pcVar7);
          free(pcVar7);
          return (lys_node *)0x0;
        }
        if (yang_data_name == (char *)0x0) {
          parent = (lys_node_list *)0x0;
        }
        else {
          parent = (lys_node_list *)lyp_get_yang_data_template(module,yang_data_name,local_80);
          if (parent == (lys_node_list *)0x0) {
            local_78 = yang_data_name + ((long)local_80 - (long)local_68);
LAB_001135ad:
            pcVar7 = strndup(local_68,(size_t)local_78);
            ecode = LYE_PATH_INNODE;
            ctx_00 = (ly_ctx *)mod_name;
            goto LAB_001135c2;
          }
        }
        local_50 = (char *)0x0;
        nam_len = 0;
      }
      else {
        parent = (lys_node_list *)start;
        if (start == (lys_node *)0x0) {
          __assert_fail("start",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0x957,
                        "const struct lys_node *resolve_json_nodeid(const char *, const struct ly_ctx *, const struct lys_node *, int)"
                       );
        }
        for (; (parent != (lys_node_list *)0x0 && (parent->nodetype == LYS_USES));
            parent = (lys_node_list *)lys_parent((lys_node *)parent)) {
        }
        module = start->module;
      }
      pcStack_58 = pcStack_58 + uVar8;
      name = (char *)module;
      do {
        list = (lys_node_list *)0x0;
LAB_001133f4:
        do {
          do {
            do {
              list = (lys_node_list *)lys_getnext((lys_node *)list,(lys_node *)parent,module,0);
              if (list == (lys_node_list *)0x0) {
                local_78 = local_78 + ((long)local_3c - (long)local_68);
                goto LAB_001135ad;
              }
              pcVar7 = list->name;
            } while (pcVar7 == (char *)0x0);
            __n = (size_t)local_3c;
            iVar4 = strncmp(local_78,pcVar7,__n);
          } while ((iVar4 != 0) || (node = list, pcVar7[__n] != '\0'));
          do {
            node = (lys_node_list *)lys_parent((lys_node *)node);
            if (node == (lys_node_list *)0x0) goto LAB_00113468;
            LVar2 = node->nodetype;
          } while ((LVar2 & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN);
          if (output == 0) {
            if (LVar2 == LYS_OUTPUT) goto LAB_001133f4;
          }
          else if (LVar2 == LYS_INPUT) goto LAB_001133f4;
LAB_00113468:
          plVar5 = (lys_module *)name;
          if ((local_50 != (char *)0x0) &&
             (plVar5 = ly_ctx_nget_module((ly_ctx *)mod_name,local_50,(long)nam_len,(char *)0x0,1),
             plVar5 == (lys_module *)0x0)) {
            pcVar7 = strndup(local_68,(size_t)(local_50 + ((long)nam_len - (long)local_68)));
            ecode = LYE_PATH_INMOD;
            ctx_00 = (ly_ctx *)mod_name;
            goto LAB_001135c2;
          }
          plVar6 = lys_node_module((lys_node *)list);
          ctx = (ly_ctx *)mod_name;
          pcVar7 = pcStack_58;
        } while (plVar5 != plVar6);
        if (local_5c != 0) {
          local_40 = 0;
          if ((list->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            if (list->nodetype != LYS_LIST) {
              cVar1 = *pcStack_58;
              goto LAB_001136f7;
            }
            iVar4 = resolve_json_schema_list_predicate(pcStack_58,list,(int *)&local_40);
            pcVar7 = pcStack_58;
            if (iVar4 != 0) {
              return (lys_node *)0x0;
            }
          }
          else {
            local_40 = parse_schema_json_predicate
                                 (pcStack_58,(char **)0x0,(int *)0x0,(char **)0x0,(int *)0x0,
                                  (char **)0x0,(int *)0x0,&local_5c);
            if ((int)local_40 < 1) goto LAB_001136ec;
          }
          pcVar7 = pcVar7 + (int)local_40;
        }
        uVar8 = (ulong)(uint)(int)*pcVar7;
        if ((int)*pcVar7 == 0) {
          return (lys_node *)list;
        }
        if ((list->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
        goto LAB_001135f0;
        name = (char *)module;
        if (list->child != (lys_node *)0x0) {
          name = (char *)lys_node_module(list->child);
        }
        local_40 = parse_schema_nodeid(pcVar7,&local_50,&nam_len,&local_78,&local_3c,&local_38,
                                       &local_5c,(int *)0x0,0);
        if ((int)local_40 < 1) goto LAB_001136ec;
        pcStack_58 = pcVar7 + local_40;
        parent = list;
        mod_name = (char *)ctx;
      } while( true );
    }
    pcVar7 = id + -local_40;
    uVar8 = (ulong)(uint)(int)id[-local_40];
    ctx = (ly_ctx *)mod_name;
  }
  goto LAB_001135f0;
LAB_001136ec:
  cVar1 = pcVar7[-local_40];
  pcVar7 = pcVar7 + -local_40;
LAB_001136f7:
  uVar8 = (ulong)(uint)(int)cVar1;
LAB_001135f0:
  ly_vlog(ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar8,pcVar7);
  return (lys_node *)0x0;
}

Assistant:

const struct lys_node *
resolve_json_nodeid(const char *nodeid, const struct ly_ctx *ctx, const struct lys_node *start, int output)
{
    char *str;
    const char *name, *mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    const struct lys_node *sibling, *start_parent, *parent;
    int r, nam_len, mod_name_len, is_relative = -1, has_predicate;
    int yang_data_name_len, backup_mod_name_len;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *prefix_mod, *module, *prev_mod;

    assert(nodeid && (ctx || start));
    if (!ctx) {
        ctx = start->module->ctx;
    }

    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return NULL;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        id += r;
    } else {
        is_relative = -1;
    }

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    if (is_relative) {
        assert(start);
        start_parent = start;
        while (start_parent && (start_parent->nodetype == LYS_USES)) {
            start_parent = lys_parent(start_parent);
        }
        module = start->module;
    } else {
        if (!mod_name) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_STR, nodeid);
            free(str);
            return NULL;
        }

        str = strndup(mod_name, mod_name_len);
        module = ly_ctx_get_module(ctx, str, NULL, 1);
        free(str);

        if (!module) {
            str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        start_parent = NULL;
        if (yang_data_name) {
            start_parent = lyp_get_yang_data_template(module, yang_data_name, yang_data_name_len);
            if (!start_parent) {
                str = strndup(nodeid, (yang_data_name + yang_data_name_len) - nodeid);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return NULL;
            }
        }

        /* now it's as if there was no module name */
        mod_name = NULL;
        mod_name_len = 0;
    }

    prev_mod = module;

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, module, 0))) {
            /* name match */
            if (sibling->name && !strncmp(name, sibling->name, nam_len) && !sibling->name[nam_len]) {
                /* output check */
                for (parent = lys_parent(sibling); parent && !(parent->nodetype & (LYS_INPUT | LYS_OUTPUT)); parent = lys_parent(parent));
                if (parent) {
                    if (output && (parent->nodetype == LYS_INPUT)) {
                        continue;
                    } else if (!output && (parent->nodetype == LYS_OUTPUT)) {
                        continue;
                    }
                }

                /* module check */
                if (mod_name) {
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_nget_module(ctx, mod_name, mod_name_len, NULL, 1);

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lys_node_module(sibling)) {
                    continue;
                }

                /* do we have some predicates on it? */
                if (has_predicate) {
                    r = 0;
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if ((r = parse_schema_json_predicate(id, NULL, NULL, NULL, NULL, NULL, NULL, &has_predicate)) < 1) {
                            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                            return NULL;
                        }
                    } else if (sibling->nodetype == LYS_LIST) {
                        if (resolve_json_schema_list_predicate(id, (const struct lys_node_list *)sibling, &r)) {
                            return NULL;
                        }
                    } else {
                        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    id += r;
                }

                /* the result node? */
                if (!id[0]) {
                    return sibling;
                }

                /* move down the tree, if possible */
                if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                    return NULL;
                }
                start_parent = sibling;

                /* update prev mod */
                prev_mod = (start_parent->child ? lys_node_module(start_parent->child) : module);
                break;
            }
        }

        /* no match */
        if (!sibling) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return NULL;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT(ctx);
    return NULL;
}